

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

void Cba_BlastConst(Cba_Ntk_t *p,Vec_Int_t *vOut,int iFon,int nTotal,int fSigned)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int Fill;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  
  iVar2 = Cba_FonConst(iFon);
  pcVar4 = Cba_NtkConst(p,iVar2);
  sVar5 = strlen(pcVar4);
  iVar2 = atoi(pcVar4);
  if (nTotal < iVar2) {
    pcVar4 = "nBits <= nTotal";
    uVar3 = 0x52;
  }
  else {
    pcVar7 = pcVar4 + sVar5;
    pcVar6 = pcVar4;
    do {
      pcVar9 = pcVar6;
      pcVar6 = pcVar9 + 1;
    } while ((byte)(*pcVar9 - 0x30U) < 10);
    if (*pcVar9 == '\'') {
      pcVar9 = pcVar9 + 2;
      if (*pcVar6 != 's') {
        pcVar9 = pcVar6;
      }
      vOut->nSize = 0;
      cVar1 = *pcVar9;
      if (cVar1 == 'b') {
        pcVar4 = pcVar4 + sVar5;
        while (pcVar4 = pcVar4 + -1, pcVar9 < pcVar4) {
          Vec_IntPush(vOut,(uint)(*pcVar4 != '0'));
        }
      }
      else {
        if (cVar1 == 'd') {
          uVar3 = atoi(pcVar9 + 1);
          for (uVar8 = 0; uVar8 != 0x20; uVar8 = uVar8 + 1) {
            Vec_IntPush(vOut,(uint)((uVar3 >> (uVar8 & 0x1f) & 1) != 0));
          }
        }
        else {
          if (cVar1 != 'h') {
            pcVar4 = "0";
            uVar3 = 0x73;
            goto LAB_006e8998;
          }
          while (pcVar7 = pcVar7 + -1, pcVar9 < pcVar7) {
            uVar3 = Cba_ReadHexDigit(*pcVar7);
            for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
              Vec_IntPush(vOut,(uint)((uVar3 >> (uVar8 & 0x1f) & 1) != 0));
            }
          }
        }
        if (nTotal < vOut->nSize) {
          Vec_IntShrink(vOut,nTotal);
        }
      }
      if ((fSigned != 0) && (iVar2 = nTotal - vOut->nSize, iVar2 != 0 && vOut->nSize <= nTotal)) {
        Fill = Vec_IntEntryLast(vOut);
        Vec_IntFillExtra(vOut,iVar2,Fill);
        return;
      }
      return;
    }
    pcVar4 = "*pConst == \'\\\'\'";
    uVar3 = 0x55;
  }
LAB_006e8998:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                ,uVar3,"void Cba_BlastConst(Cba_Ntk_t *, Vec_Int_t *, int, int, int)");
}

Assistant:

void Cba_BlastConst( Cba_Ntk_t * p, Vec_Int_t * vOut, int iFon, int nTotal, int fSigned )
{
    char * pConst = Cba_NtkConst(p, Cba_FonConst(iFon));
    char * pLimit = pConst + strlen(pConst);
    int i, Number, nBits = atoi( pConst );
    assert( nBits <= nTotal );
    while ( *pConst >= '0' && *pConst <= '9' )
        pConst++;
    assert( *pConst == '\'' );
    pConst++;
    if ( *pConst == 's' ) // assume signedness is already used in setting fSigned
        pConst++;
    Vec_IntClear( vOut );
    if ( *pConst == 'b' )
    {
        while ( --pLimit > pConst )
            Vec_IntPush( vOut, *pLimit == '0' ? 0 : 1 );
    }
    else if ( *pConst == 'h' )
    {
        while ( --pLimit > pConst )
        {
            Number = Cba_ReadHexDigit( *pLimit );
            for ( i = 0; i < 4; i++ )
                Vec_IntPush( vOut, (Number >> i) & 1 );
        }
        if ( Vec_IntSize(vOut) > nTotal )
            Vec_IntShrink( vOut, nTotal );
    }
    else if ( *pConst == 'd' )
    {
        Number = atoi( pConst+1 );
        assert( Number <= 0x7FFFFFFF );
        for ( i = 0; i < 32; i++ )
            Vec_IntPush( vOut, (Number >> i) & 1 );
        if ( Vec_IntSize(vOut) > nTotal )
            Vec_IntShrink( vOut, nTotal );
    }
    else assert( 0 );
    if ( fSigned && Vec_IntSize(vOut) < nTotal )
        Vec_IntFillExtra( vOut, nTotal - Vec_IntSize(vOut), Vec_IntEntryLast(vOut) );
}